

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

bool ON_Internal_RemoveCommonFactors(double rel_zero_tol,double factor,double *x,double *y)

{
  bool bVar1;
  double __x;
  double dVar2;
  double dVar3;
  double local_68;
  double t;
  double s;
  bool rc;
  double factor_tol;
  double fat_eps;
  double *y_local;
  double *x_local;
  double factor_local;
  double rel_zero_tol_local;
  
  bVar1 = false;
  if ((((0.0 < *x) && (bVar1 = false, 0.0 < *y)) && (bVar1 = false, 0.0 < factor)) &&
     (bVar1 = false, 0.0 <= rel_zero_tol)) {
    bVar1 = rel_zero_tol < 0.01;
  }
  if (bVar1) {
    if ((factor != 1.0) || (NAN(factor))) {
      if ((4503599627370496.0 < *x || *x == 4503599627370496.0) ||
         (4503599627370496.0 < *y || *y == 4503599627370496.0)) {
        rel_zero_tol_local._7_1_ = false;
      }
      else {
        local_68 = rel_zero_tol;
        if (rel_zero_tol <= 8.881784197001252e-16) {
          local_68 = 8.881784197001252e-16;
        }
        if ((factor <= *x * local_68) || (factor <= *y * local_68)) {
          rel_zero_tol_local._7_1_ = false;
        }
        else {
          rel_zero_tol_local._7_1_ = false;
          while( true ) {
            __x = ON_InternalQuotient(local_68,*x,factor);
            dVar2 = floor(__x);
            if ((__x != dVar2) || (NAN(__x) || NAN(dVar2))) break;
            dVar2 = ON_InternalQuotient(local_68,*y,factor);
            dVar3 = floor(dVar2);
            if (dVar2 != dVar3) {
              return rel_zero_tol_local._7_1_;
            }
            if (NAN(dVar2) || NAN(dVar3)) {
              return rel_zero_tol_local._7_1_;
            }
            if (1.0 <= factor) {
              if (*x <= __x) {
                return rel_zero_tol_local._7_1_;
              }
              if (*y <= dVar2) {
                return rel_zero_tol_local._7_1_;
              }
            }
            rel_zero_tol_local._7_1_ = true;
            *x = __x;
            *y = dVar2;
            if (factor < 2.0) {
              return true;
            }
            if (*x < factor * 0.9999999999999991) {
              return true;
            }
            if (*y < factor * 0.9999999999999991) {
              return true;
            }
          }
        }
      }
    }
    else {
      rel_zero_tol_local._7_1_ = true;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x563,"","Invalid input parameters.");
    rel_zero_tol_local._7_1_ = false;
  }
  return rel_zero_tol_local._7_1_;
}

Assistant:

static bool ON_Internal_RemoveCommonFactors(const double rel_zero_tol, const double factor, double& x, double& y)
{
  if (false == (x > 0.0 && y > 0.0 && factor > 0.0 && rel_zero_tol >= 0.0 && rel_zero_tol < 0.01))
  {
    ON_ERROR("Invalid input parameters.");
    return false;
  }
  if (1.0 == factor)
    return true; // nothing to do

  if (!(x < 1.0 / ON_EPSILON && y < 1.0 / ON_EPSILON))
  {
    // x or y is too big for this code to work with IEEE double arithmetic.
    return false;
  }

  const double fat_eps = 4.0*ON_EPSILON;
  const double factor_tol = (rel_zero_tol > fat_eps) ? rel_zero_tol : fat_eps;
  if (!(factor > x*factor_tol && factor > y*factor_tol))
  {
    // factor is too small for the ON_ScaleValue context where this
    // function is designed to be used.
    return false;
  }

  bool rc = false;
  for (;;)
  {
    const double s = ON_InternalQuotient(factor_tol,x,factor);
    if (!(s == floor(s)))
      break;


    const double t = ON_InternalQuotient(factor_tol,y,factor);
    if (!(t == floor(t)))
      break;
    
    if (factor >= 1.0)
    {
      if (!(s < x && t < y))
        break;
    }

    rc = true;
    x = s;
    y = t;

    if ( !(factor >= 2.0 && x >= factor*(1.0-fat_eps) && y >= factor*(1.0-fat_eps)) )
      break;
  }

  return rc;
}